

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MessageQueue.h
# Opt level: O3

MessageBase * __thiscall MessageQueue::PopAndWait(MessageQueue *this)

{
  uint uVar1;
  MessageQueue MVar2;
  DListNode<MessageQueue::ListEntry> *pDVar3;
  SortedList<MessageQueue::ListEntry> SVar4;
  DWORD DVar5;
  DListNode<MessageQueue::ListEntry> **ppDVar6;
  ListEntry LVar7;
  
  if ((this->m_queue).head != (DListNode<MessageQueue::ListEntry> *)0x0) {
    LVar7 = SortedList<MessageQueue::ListEntry>::Pop(&this->m_queue);
    uVar1 = (LVar7.message)->m_time;
    DVar5 = GetTickCount();
    DVar5 = uVar1 - DVar5;
    if (0 < (int)DVar5) {
      Sleep(DVar5);
    }
    return LVar7.message;
  }
  PopAndWait();
  MVar2.m_queue.head = this->m_queue;
  uVar1 = *(uint *)MVar2.m_queue.head;
  pDVar3 = *(DListNode<MessageQueue::ListEntry> **)((long)MVar2.m_queue.head + 0x10);
  SVar4.head = *(DListNode<MessageQueue::ListEntry> **)((long)MVar2.m_queue.head + 0x18);
  ppDVar6 = &pDVar3->next;
  if (pDVar3 == (DListNode<MessageQueue::ListEntry> *)0x0) {
    ppDVar6 = (DListNode<MessageQueue::ListEntry> **)this;
  }
  *ppDVar6 = SVar4.head;
  if (SVar4.head != (DListNode<MessageQueue::ListEntry> *)0x0) {
    (SVar4.head)->prev = pDVar3;
  }
  operator_delete((void *)MVar2.m_queue.head);
  return (MessageBase *)(ulong)uVar1;
}

Assistant:

MessageBase* PopAndWait()
    {
        Assert(!m_queue.IsEmpty());

        ListEntry entry = m_queue.Pop();
        MessageBase *tmp = entry.message;

        int waitTime = tmp->GetTime() - GetTickCount();
        if(waitTime > 0)
        {
            Sleep(waitTime);
        }

        return tmp;
    }